

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O0

double __thiscall EncoderVelocity::GetEncoderVelocity(EncoderVelocity *this)

{
  double local_20;
  double vel;
  uint32_t delta;
  EncoderVelocity *this_local;
  
  vel._4_4_ = (uint)(this->velPeriod == 0);
  local_20 = 0.0;
  if ((((this->velOverflow & 1U) == 0) && ((this->dirChange & 1U) == 0)) &&
     (local_20 = 4.0 / ((double)(this->velPeriod + vel._4_4_) * this->clkPeriod),
     (this->velDir & 1U) == 0)) {
    local_20 = -local_20;
  }
  return local_20;
}

Assistant:

double EncoderVelocity::GetEncoderVelocity() const
{
    uint32_t delta = 0;
    // Avoid divide by 0 (should never happen)
    if (velPeriod == 0) delta = 1;

    double vel = 0.0;
    if (!velOverflow && !dirChange) {
        vel = 4.0/((velPeriod+delta)*clkPeriod);
        if (!velDir)
            vel = -vel;
    }

    return vel;
}